

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O0

PointerReader * __thiscall
capnp::_::ListReader::getPointerElement
          (PointerReader *__return_storage_ptr__,ListReader *this,ElementCount index)

{
  uint uVar1;
  SegmentReader *segment;
  CapTableReader *capTable;
  byte *pbVar2;
  unsigned_long uVar3;
  uint offset;
  ElementCount index_local;
  ListReader *this_local;
  
  uVar1 = this->structDataSize;
  segment = this->segment;
  capTable = this->capTable;
  pbVar2 = this->ptr;
  uVar3 = upgradeBound<unsigned_long,unsigned_int>(index);
  PointerReader::PointerReader
            (__return_storage_ptr__,segment,capTable,
             (WirePointer *)(pbVar2 + (uVar3 * this->step >> 3) + (ulong)(uVar1 >> 3)),
             this->nestingLimit);
  return __return_storage_ptr__;
}

Assistant:

inline PointerReader ListReader::getPointerElement(ElementCount index) const {
  // If the list elements have data sections we need to skip those. Note that for pointers to be
  // present at all (which already must be true if we get here), then `structDataSize` must be a
  // whole number of words, so we don't have to worry about unaligned reads here.
  auto offset = structDataSize / BITS_PER_BYTE;
  return PointerReader(segment, capTable, reinterpret_cast<const WirePointer*>(
      ptr + offset + upgradeBound<uint64_t>(index) * step / BITS_PER_BYTE), nestingLimit);
}